

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::fresnel::sgd::sgd(sgd *this,vec3 *f0,vec3 *f1)

{
  valarray<float> local_50;
  valarray<float> local_40 [2];
  vec3 *local_20;
  vec3 *f1_local;
  vec3 *f0_local;
  sgd *this_local;
  
  local_20 = f1;
  f1_local = f0;
  f0_local = (vec3 *)this;
  impl::impl(&this->super_impl);
  (this->super_impl)._vptr_impl = (_func_int **)&PTR_clone_00264c48;
  std::valarray<float>::valarray(&this->f0);
  std::valarray<float>::valarray(&this->f1);
  std::valarray<float>::valarray(local_40,&f1_local->x,3);
  std::valarray<float>::operator=(&this->f0,local_40);
  std::valarray<float>::~valarray(local_40);
  std::valarray<float>::valarray(&local_50,&local_20->x,3);
  std::valarray<float>::operator=(&this->f1,&local_50);
  std::valarray<float>::~valarray(&local_50);
  return;
}

Assistant:

sgd::sgd(const vec3 &f0, const vec3 &f1)
{
	this->f0 = brdf::value_type(&f0.x, 3);
	this->f1 = brdf::value_type(&f1.x, 3);
}